

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

unqlite_value * unqlite_vm_extract_variable(unqlite_vm *pVm,char *zVarname)

{
  jx9_value *pjVar1;
  SyString sVariable;
  SyString local_18;
  
  if (pVm == (unqlite_vm *)0x0) {
    return (unqlite_value *)0x0;
  }
  if (pVm->nMagic != 0xdead2bad) {
    local_18.zString = zVarname;
    local_18.nByte = SyStrlen(zVarname);
    if (pVm->pJx9Vm->nMagic == 0xcdfe1dad) {
      pjVar1 = VmExtractMemObj(pVm->pJx9Vm,&local_18,0,0);
      return pjVar1;
    }
  }
  return (unqlite_value *)0x0;
}

Assistant:

unqlite_value * unqlite_vm_extract_variable(unqlite_vm *pVm,const char *zVarname)
{
	unqlite_value *pValue;
	SyString sVariable;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return 0;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return 0; /* Another thread have released this instance */
	 }
#endif
	 /* Extract the target variable */
	SyStringInitFromBuf(&sVariable,zVarname,SyStrlen(zVarname));
	pValue = jx9VmExtractVariable(pVm->pJx9Vm,&sVariable);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return pValue;
}